

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cc
# Opt level: O2

void __thiscall tt::net::TimerManager::handleExpiredEvent(TimerManager *this)

{
  __shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  undefined1 local_30 [8];
  SPTimerNode ptimer_now;
  
  while( true ) {
    p_Var1 = &((this->timerNodeQueue).c.
               super__Deque_base<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>;
    if (&((this->timerNodeQueue).c.
          super__Deque_base<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
         super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2> == p_Var1) {
      return;
    }
    std::__shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2> *)local_30,p_Var1);
    if ((*(bool *)local_30 == false) && (bVar2 = TimerNode::isValid((TimerNode *)local_30), bVar2))
    break;
    std::
    priority_queue<std::shared_ptr<tt::net::TimerNode>,_std::deque<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>,_tt::net::TimerCmp>
    ::pop(&this->timerNodeQueue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptimer_now);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptimer_now);
  return;
}

Assistant:

void TimerManager::handleExpiredEvent() {
  // MutexLockGuard locker(lock);
  while (!timerNodeQueue.empty()) {
    SPTimerNode ptimer_now = timerNodeQueue.top();
    if (ptimer_now->isDeleted())
      timerNodeQueue.pop();
    else if (ptimer_now->isValid() == false)
      timerNodeQueue.pop();
    else
      break;
  }
}